

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadNodeGeometry(ColladaParser *this,Node *pNode)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SemanticMappingTable s;
  MeshInstance instance;
  string group;
  SemanticMappingTable local_f0;
  value_type local_a0;
  key_type local_50;
  
  uVar3 = GetAttribute(this,"url");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
  if (*(char *)CONCAT44(extraout_var,iVar4) != '#') {
    std::__cxx11::string::string
              ((string *)&local_a0,"Unknown reference format",(allocator *)&local_f0);
    ThrowException(this,&local_a0.mMeshOrController);
  }
  local_a0.mMeshOrController._M_dataplus._M_p = (pointer)&local_a0.mMeshOrController.field_2;
  local_a0.mMeshOrController._M_string_length = 0;
  local_a0.mMeshOrController.field_2._M_local_buf[0] = '\0';
  local_a0.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a0.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0.mMaterials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::assign((char *)&local_a0);
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar4 == '\0') {
    p_Var1 = &local_f0.mMap._M_t._M_impl.super__Rb_tree_header;
    do {
      do {
        while( true ) {
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar4 == '\0') goto LAB_00404d30;
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar4 != 1) break;
          bVar2 = IsElement(this,"instance_material");
          if (bVar2) {
            uVar3 = GetAttribute(this,"symbol");
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            std::__cxx11::string::string
                      ((string *)&local_50,(char *)CONCAT44(extraout_var_00,iVar4),
                       (allocator *)&local_f0);
            uVar3 = GetAttribute(this,"target");
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            local_f0.mMatName._M_dataplus._M_p = (pointer)&local_f0.mMatName.field_2;
            local_f0.mMatName._M_string_length = 0;
            local_f0.mMatName.field_2._M_local_buf[0] = '\0';
            local_f0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_f0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_f0.mMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_f0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            local_f0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
            ;
            std::__cxx11::string::assign((char *)&local_f0);
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
            if ((char)iVar4 == '\0') {
              ReadMaterialVertexInputBinding(this,&local_f0);
            }
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                      ::operator[](&local_a0.mMaterials,&local_50);
            Collada::SemanticMappingTable::operator=(this_00,&local_f0);
            Collada::SemanticMappingTable::~SemanticMappingTable(&local_f0);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar4 != 2);
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"instance_geometry");
      if (iVar4 == 0) break;
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar4 = strcmp((char *)CONCAT44(extraout_var_02,iVar4),"instance_controller");
    } while (iVar4 != 0);
  }
LAB_00404d30:
  std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::
  push_back(&pNode->mMeshes,&local_a0);
  Collada::MeshInstance::~MeshInstance(&local_a0);
  return;
}

Assistant:

void ColladaParser::ReadNodeGeometry(Node* pNode)
{
    // referred mesh is given as an attribute of the <instance_geometry> element
    int attrUrl = GetAttribute("url");
    const char* url = mReader->getAttributeValue(attrUrl);
    if (url[0] != '#')
        ThrowException("Unknown reference format");

    Collada::MeshInstance instance;
    instance.mMeshOrController = url + 1; // skipping the leading #

    if (!mReader->isEmptyElement())
    {
        // read material associations. Ignore additional elements in between
        while (mReader->read())
        {
            if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
            {
                if (IsElement("instance_material"))
                {
                    // read ID of the geometry subgroup and the target material
                    int attrGroup = GetAttribute("symbol");
                    std::string group = mReader->getAttributeValue(attrGroup);
                    int attrMaterial = GetAttribute("target");
                    const char* urlMat = mReader->getAttributeValue(attrMaterial);
                    Collada::SemanticMappingTable s;
                    if (urlMat[0] == '#')
                        urlMat++;

                    s.mMatName = urlMat;

                    // resolve further material details + THIS UGLY AND NASTY semantic mapping stuff
                    if (!mReader->isEmptyElement())
                        ReadMaterialVertexInputBinding(s);

                    // store the association
                    instance.mMaterials[group] = s;
                }
            }
            else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
            {
                if (strcmp(mReader->getNodeName(), "instance_geometry") == 0
                    || strcmp(mReader->getNodeName(), "instance_controller") == 0)
                    break;
            }
        }
    }

    // store it
    pNode->mMeshes.push_back(instance);
}